

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

string * el::base::utils::OS::currentHost_abi_cxx11_(void)

{
  string *in_RDI;
  char *in_stack_00000038;
  char *in_stack_00000040;
  char *in_stack_00000048;
  
  getEnvironmentVariable_abi_cxx11_(in_stack_00000048,in_stack_00000040,in_stack_00000038);
  return in_RDI;
}

Assistant:

std::string OS::currentHost(void) {
#if ELPP_OS_UNIX && !ELPP_OS_ANDROID
  return getEnvironmentVariable("HOSTNAME", base::consts::kUnknownHost, "hostname");
#elif ELPP_OS_WINDOWS
  return getEnvironmentVariable("COMPUTERNAME", base::consts::kUnknownHost);
#elif ELPP_OS_ANDROID
  ELPP_UNUSED(base::consts::kUnknownHost);
  return getDeviceName();
#else
  return std::string();
#endif  // ELPP_OS_UNIX && !ELPP_OS_ANDROID
}